

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O3

int mbedtls_hmac_drbg_update_ret(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t add_len)

{
  uchar *input;
  byte bVar1;
  int iVar2;
  ulong ilen;
  uchar K [64];
  byte local_8d;
  int local_8c;
  uchar *local_88;
  size_t local_80;
  uchar local_78 [72];
  
  bVar1 = mbedtls_md_get_size((ctx->md_ctx).md_info);
  ilen = (ulong)bVar1;
  input = ctx->V;
  local_8d = 0;
  local_8c = (int)CONCAT71((int7)((ulong)additional >> 8),add_len != 0 && additional != (uchar *)0x0
                          ) + 1;
  local_88 = additional;
  local_80 = add_len;
  do {
    iVar2 = mbedtls_md_hmac_reset(&ctx->md_ctx);
    if ((((((iVar2 != 0) || (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen), iVar2 != 0))
          || (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,&local_8d,1), iVar2 != 0)) ||
         ((add_len != 0 && additional != (uchar *)0x0 &&
          (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,local_88,local_80), iVar2 != 0)))) ||
        ((iVar2 = mbedtls_md_hmac_finish(&ctx->md_ctx,local_78), iVar2 != 0 ||
         ((iVar2 = mbedtls_md_hmac_starts(&ctx->md_ctx,local_78,ilen), iVar2 != 0 ||
          (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen), iVar2 != 0)))))) ||
       (iVar2 = mbedtls_md_hmac_finish(&ctx->md_ctx,input), iVar2 != 0)) goto LAB_001204f8;
    local_8d = local_8d + 1;
  } while (local_8d < (byte)local_8c);
  iVar2 = 0;
LAB_001204f8:
  mbedtls_platform_zeroize(local_78,0x40);
  return iVar2;
}

Assistant:

int mbedtls_hmac_drbg_update_ret( mbedtls_hmac_drbg_context *ctx,
                                  const unsigned char *additional,
                                  size_t add_len )
{
    size_t md_len = mbedtls_md_get_size( ctx->md_ctx.md_info );
    unsigned char rounds = ( additional != NULL && add_len != 0 ) ? 2 : 1;
    unsigned char sep[1];
    unsigned char K[MBEDTLS_MD_MAX_SIZE];
    int ret = MBEDTLS_ERR_MD_BAD_INPUT_DATA;

    for( sep[0] = 0; sep[0] < rounds; sep[0]++ )
    {
        /* Step 1 or 4 */
        if( ( ret = mbedtls_md_hmac_reset( &ctx->md_ctx ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                            ctx->V, md_len ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                            sep, 1 ) ) != 0 )
            goto exit;
        if( rounds == 2 )
        {
            if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                                additional, add_len ) ) != 0 )
            goto exit;
        }
        if( ( ret = mbedtls_md_hmac_finish( &ctx->md_ctx, K ) ) != 0 )
            goto exit;

        /* Step 2 or 5 */
        if( ( ret = mbedtls_md_hmac_starts( &ctx->md_ctx, K, md_len ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                            ctx->V, md_len ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_finish( &ctx->md_ctx, ctx->V ) ) != 0 )
            goto exit;
    }

exit:
    mbedtls_platform_zeroize( K, sizeof( K ) );
    return( ret );
}